

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExprList(WastParser *this,ExprList *exprs)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  __off64_t *in_R8;
  size_t in_R9;
  ExprList new_exprs;
  
  new_exprs.size_ = 0;
  new_exprs.first_ = (Expr *)0x0;
  new_exprs.last_ = (Expr *)0x0;
  EVar3 = Ok;
  do {
    while( true ) {
      bVar1 = PeekMatchExpr(this);
      if (!bVar1) goto LAB_001855c6;
      RVar2 = ParseExpr(this,&new_exprs);
      if (RVar2.enum_ != Ok) break;
      intrusive_list<wabt::Expr>::splice
                (exprs,(int)exprs,(__off64_t *)0x0,(int)&new_exprs,in_R8,in_R9,
                 (uint)new_exprs.first_);
    }
    RVar2 = Synchronize(this,anon_unknown_1::IsExpr);
  } while (RVar2.enum_ != Error);
  EVar3 = Error;
LAB_001855c6:
  intrusive_list<wabt::Expr>::clear(&new_exprs);
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseExprList(ExprList* exprs) {
  WABT_TRACE(ParseExprList);
  ExprList new_exprs;
  while (PeekMatchExpr()) {
    if (Succeeded(ParseExpr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsExpr));
    }
  }
  return Result::Ok;
}